

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateFunctionCall4(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   ExprBase *arg1,ExprBase *arg2,ExprBase *arg3,bool allowFailure,bool allowInternal
                   ,bool allowFastLookup)

{
  Allocator *pAVar1;
  ExprBase *pEVar2;
  long lVar3;
  ArrayView<ArgumentData> arguments;
  undefined8 uStack_110;
  SmallArray<ArgumentData,_4U> local_108;
  
  pAVar1 = ctx->allocator;
  lVar3 = 0x20;
  do {
    *(undefined8 *)(&stack0xfffffffffffffee8 + lVar3) = 0;
    *(undefined1 *)((long)&uStack_110 + lVar3) = 0;
    *(undefined8 *)((long)local_108.little + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)local_108.little + lVar3 + -8) = 0;
    *(undefined8 *)((long)&local_108.little[0].source + lVar3) = 0;
    *(undefined8 *)(&local_108.little[0].isExplicit + lVar3) = 0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0xe0);
  local_108.data = local_108.little;
  local_108.max = 4;
  local_108.little[0].source = arg0->source;
  local_108.little[0].type = arg0->type;
  local_108.little[0].isExplicit = false;
  local_108.little[0].name = (SynIdentifier *)0x0;
  local_108.little[0].valueFunction = (FunctionData *)0x0;
  local_108.little[1].source = arg1->source;
  local_108.little[1].type = arg1->type;
  local_108.little[1].isExplicit = false;
  local_108.little[1].name = (SynIdentifier *)0x0;
  local_108.little[1].valueFunction = (FunctionData *)0x0;
  local_108.little[2].source = arg2->source;
  local_108.little[2].type = arg2->type;
  local_108.little[2].isExplicit = false;
  local_108.little[2].name = (SynIdentifier *)0x0;
  local_108.little[2].value = arg2;
  local_108.little[2].valueFunction = (FunctionData *)0x0;
  local_108.little[3].source = arg3->source;
  local_108.little[3].type = arg3->type;
  local_108.count = 4;
  local_108.little[3].isExplicit = false;
  local_108.little[3].name = (SynIdentifier *)0x0;
  local_108.little[3].value = arg3;
  local_108.little[3].valueFunction = (FunctionData *)0x0;
  arguments._8_8_ = 4;
  arguments.data = local_108.data;
  local_108.little[0].value = arg0;
  local_108.little[1].value = arg1;
  local_108.allocator = pAVar1;
  pEVar2 = CreateFunctionCallByName
                     (ctx,source,name,arguments,allowFailure,allowInternal,allowFastLookup);
  uStack_110 = 0x151c2a;
  SmallArray<ArgumentData,_4U>::~SmallArray(&local_108);
  return pEVar2;
}

Assistant:

ExprBase* CreateFunctionCall4(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, ExprBase *arg1, ExprBase *arg2, ExprBase *arg3, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 4> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));
	arguments.push_back(ArgumentData(arg1->source, false, NULL, arg1->type, arg1));
	arguments.push_back(ArgumentData(arg2->source, false, NULL, arg2->type, arg2));
	arguments.push_back(ArgumentData(arg3->source, false, NULL, arg3->type, arg3));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}